

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cstr_test.c
# Opt level: O2

void basic_tests(zt_unit_test *test,void *data)

{
  int iVar1;
  zt_log_ty *log;
  FILE *__stream;
  char *pcVar2;
  undefined1 auVar3 [16];
  undefined8 uStack_850;
  int date;
  int pid;
  zt_log_ty *local_840;
  char msg [255];
  char sysname [255];
  char time [255];
  char month [255];
  char progname [255];
  char level [255];
  char position2 [255];
  char position1 [255];
  
  log = zt_log_file("log.err",0,0x1f);
  zt_progname("./unit_test",1);
  local_840 = zt_log_logger(log);
  zt_log_set_opts(log,0);
  zt_log_lprintf((zt_log_ty *)0x0,zt_log_debug,"ZT_LOG_RAW");
  zt_log_set_opts(log,1);
  zt_log_lprintf((zt_log_ty *)0x0,zt_log_debug,"ZT_LOG_WITH_DATE");
  zt_log_set_opts(log,2);
  zt_log_lprintf((zt_log_ty *)0x0,zt_log_debug,"ZT_LOG_WITH_LEVEL");
  zt_log_set_opts(log,4);
  zt_log_lprintf((zt_log_ty *)0x0,zt_log_debug,"ZT_LOG_WITH_SYSNAME");
  zt_log_set_opts(log,0xc);
  zt_log_lprintf((zt_log_ty *)0x0,zt_log_debug,"ZT_LOG_WITH_SYSNAME | ZT_LOG_WITH_PROGNAME");
  zt_log_set_opts(log,8);
  zt_log_lprintf((zt_log_ty *)0x0,zt_log_debug,"ZT_LOG_WITH_PROGNAME");
  zt_log_set_opts(log,0x10);
  zt_log_lprintf((zt_log_ty *)0x0,zt_log_debug,"ZT_LOG_WITH_PID");
  zt_log_set_opts(log,0x1d);
  zt_log_lprintf((zt_log_ty *)0x0,zt_log_debug,"ZT_LOG_EMU_SYSLOG");
  zt_log_set_opts(log,0);
  sprintf(position1,"(%s:%d)",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/log_test.c"
          ,0x3e);
  sprintf(position2,"(%s:%d)",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/log_test.c"
          ,0x3f);
  zt_log_set_debug_info
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/log_test.c"
             ,0x3f,"basic_tests");
  zt_log_lprintf(log,zt_log_debug,"lprintf with debugging");
  zt_log_logger(local_840);
  zt_log_close(log);
  __stream = fopen("log.err","r");
  pid = 0;
  date = 0;
  if (__stream == (FILE *)0x0) {
    pcVar2 = "(file)";
    uStack_850 = 0x51;
  }
  else {
    zt_unit_test_add_assertion(test);
    iVar1 = __isoc99_fscanf(__stream,"%s\n",msg);
    if (iVar1 == 1) {
      iVar1 = bcmp(msg,"ZT_LOG_RAW",0xb);
      if (iVar1 == 0) {
        zt_unit_test_add_assertion(test);
        iVar1 = __isoc99_fscanf(__stream,"%s %d %s : %s\n",month,&date,time,msg);
        if (iVar1 == 4) {
          iVar1 = bcmp(msg,"ZT_LOG_WITH_DATE",0x11);
          if (iVar1 == 0) {
            zt_unit_test_add_assertion(test);
            iVar1 = __isoc99_fscanf(__stream,"%s %s\n",level,msg);
            if (iVar1 == 2) {
              iVar1 = bcmp(msg,"ZT_LOG_WITH_LEVEL",0x12);
              if (iVar1 == 0) {
                zt_unit_test_add_assertion(test);
                iVar1 = __isoc99_fscanf(__stream,"%s %s\n",sysname,msg);
                if (iVar1 == 2) {
                  iVar1 = bcmp(msg,"ZT_LOG_WITH_SYSNAME",0x14);
                  if (iVar1 == 0) {
                    zt_unit_test_add_assertion(test);
                    iVar1 = __isoc99_fscanf(__stream,"%s %s %[A-Z_| ]\n",sysname,progname,msg);
                    if (iVar1 == 3) {
                      iVar1 = bcmp(msg,"ZT_LOG_WITH_SYSNAME | ZT_LOG_WITH_PROGNAME",0x2b);
                      if (iVar1 == 0) {
                        zt_unit_test_add_assertion(test);
                        iVar1 = __isoc99_fscanf(__stream,"%s %s\n",progname,msg);
                        if (iVar1 == 2) {
                          iVar1 = bcmp(msg,"ZT_LOG_WITH_PROGNAME",0x15);
                          if (iVar1 == 0) {
                            zt_unit_test_add_assertion(test);
                            iVar1 = __isoc99_fscanf(__stream,"[%d]: %s\n",&pid,msg);
                            if ((iVar1 == 2) &&
                               (auVar3[0] = -(msg[0] == 'Z'), auVar3[1] = -(msg[1] == 'T'),
                               auVar3[2] = -(msg[2] == '_'), auVar3[3] = -(msg[3] == 'L'),
                               auVar3[4] = -(msg[4] == 'O'), auVar3[5] = -(msg[5] == 'G'),
                               auVar3[6] = -(msg[6] == '_'), auVar3[7] = -(msg[7] == 'W'),
                               auVar3[8] = -(msg[8] == 'I'), auVar3[9] = -(msg[9] == 'T'),
                               auVar3[10] = -(msg[10] == 'H'), auVar3[0xb] = -(msg[0xb] == '_'),
                               auVar3[0xc] = -(msg[0xc] == 'P'), auVar3[0xd] = -(msg[0xd] == 'I'),
                               auVar3[0xe] = -(msg[0xe] == 'D'), auVar3[0xf] = -(msg[0xf] == '\0'),
                               (ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                                        (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                                       (ushort)(auVar3[0xf] >> 7) << 0xf) == 0xffff)) {
                              zt_unit_test_add_assertion(test);
                              iVar1 = __isoc99_fscanf(__stream,"%s %d %s %s %[a-zA-Z_-][%d]: %s\n",
                                                      month,&date,time,sysname,progname,&pid,msg);
                              if (iVar1 == 7) {
                                iVar1 = bcmp(msg,"ZT_LOG_EMU_SYSLOG",0x12);
                                if (iVar1 == 0) {
                                  zt_unit_test_add_assertion(test);
                                  fclose(__stream);
                                  return;
                                }
                              }
                              pcVar2 = "((items == 7) && (!strcmp(msg, \"ZT_LOG_EMU_SYSLOG\")))";
                              uStack_850 = 0x6b;
                            }
                            else {
                              pcVar2 = "((items == 2) && (!strcmp(msg, \"ZT_LOG_WITH_PID\")))";
                              uStack_850 = 0x68;
                            }
                            goto LAB_001107fb;
                          }
                        }
                        pcVar2 = "((items == 2) && (!strcmp(msg, \"ZT_LOG_WITH_PROGNAME\")))";
                        uStack_850 = 0x65;
                        goto LAB_001107fb;
                      }
                    }
                    pcVar2 = 
                    "((items == 3) && (!strcmp(msg, \"ZT_LOG_WITH_SYSNAME | ZT_LOG_WITH_PROGNAME\")))"
                    ;
                    uStack_850 = 0x61;
                    goto LAB_001107fb;
                  }
                }
                pcVar2 = "((items == 2) && (!strcmp(msg, \"ZT_LOG_WITH_SYSNAME\")))";
                uStack_850 = 0x5e;
                goto LAB_001107fb;
              }
            }
            pcVar2 = "((items == 2) && (!strcmp(msg, \"ZT_LOG_WITH_LEVEL\")))";
            uStack_850 = 0x5a;
            goto LAB_001107fb;
          }
        }
        pcVar2 = "((items == 4) && (!strcmp(msg, \"ZT_LOG_WITH_DATE\")))";
        uStack_850 = 0x57;
        goto LAB_001107fb;
      }
    }
    pcVar2 = "((items == 1) && (!strcmp(msg, \"ZT_LOG_RAW\")))";
    uStack_850 = 0x54;
  }
LAB_001107fb:
  iVar1 = zt_unit_printf(&test->error,"%s : %s:%d",pcVar2,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/log_test.c"
                         ,uStack_850);
  if (iVar1 == 0) {
    test->error = (char *)0x0;
  }
  longjmp((__jmp_buf_tag *)test->env,1);
}

Assistant:

static void basic_tests(struct zt_unit_test *test, void *data UNUSED) {
  char test_string1[] = "  Ok \n";
  char *chomp_test = strdup(test_string1);
  char *strip_test = strdup(test_string1);
  char *ALPHA = "ABCDEFGHIJKLMNOPQRSTUVWXYZ";
  char *AHPLA = "ZYXWVUTSRQPONMLKJIHGFEDCBA";
  char *alpha = "abcdefghijklmnopqrstuvwxyz";
  char *path = "/home/jshiffer/config.foo";
  char *iface_str = "Interface";
  char *spain = "The rain in Spain";
  char *free_me;
  char *free_me2;
  char *hex = "34aa973cd4c4daa4f61FFB2BDBAD27316534016FXXX";
  char digest[20];
  char hex2[41];
  char *split_test = "/a/b/c/d/";
  zt_ptr_array *split_array;
  zt_ptr_array *cut_array;
#if !defined(_WIN32)
  char bname[PATH_MAX + 1];
  char dname[PATH_MAX + 1];
#endif

  zt_cstr_chomp(chomp_test);
  ZT_UNIT_ASSERT(test, (strlen(chomp_test) == 5));

  zt_cstr_strip(strip_test);
  ZT_UNIT_ASSERT(test, (strlen(strip_test) == 3));

  ZT_UNIT_ASSERT(test, (zt_cstr_rspn(test_string1, "\n ") == 2));
  ZT_UNIT_ASSERT(test,
                 (zt_cstr_rspn(test_string1, "Ok\n ") == strlen(test_string1)));

  ZT_UNIT_ASSERT(test, (zt_cstr_rcspn(test_string1, "QRZ\nno") ==
                        strlen(test_string1) - 1));
  ZT_UNIT_ASSERT(test,
                 (zt_cstr_rcspn(test_string1, "Q") == strlen(test_string1)));

  split_array = zt_cstr_split(split_test, "/");
  ZT_UNIT_ASSERT_NOT_EQUAL(test, split_array, NULL);
  ZT_UNIT_ASSERT_EQUAL(
      test, strcmp((const char *)zt_ptr_array_get_idx(split_array, 0), "a"), 0);
  ZT_UNIT_ASSERT_EQUAL(
      test, strcmp((const char *)zt_ptr_array_get_idx(split_array, 1), "b"), 0);
  ZT_UNIT_ASSERT_EQUAL(
      test, strcmp((const char *)zt_ptr_array_get_idx(split_array, 2), "c"), 0);
  ZT_UNIT_ASSERT_EQUAL(
      test, strcmp((const char *)zt_ptr_array_get_idx(split_array, 3), "d"), 0);
  ZT_UNIT_ASSERT_EQUAL(test, zt_ptr_array_get_idx(split_array, 4), NULL);
  ZT_UNIT_ASSERT_EQUAL(test, zt_cstr_split_free(split_array), 0);

  cut_array = zt_cstr_cut(split_test, '/', 1);
  ZT_UNIT_ASSERT_NOT_EQUAL(test, cut_array, NULL);
  ZT_UNIT_ASSERT_EQUAL(
      test,
      strcmp((const char *)zt_ptr_array_get_idx(cut_array, 0), "/a/b/c/d/"), 0);
  ZT_UNIT_ASSERT_EQUAL(
      test, strcmp((const char *)zt_ptr_array_get_idx(cut_array, 1), "/b/c/d/"),
      0);
  ZT_UNIT_ASSERT_EQUAL(
      test, strcmp((const char *)zt_ptr_array_get_idx(cut_array, 2), "/c/d/"),
      0);
  ZT_UNIT_ASSERT_EQUAL(
      test, strcmp((const char *)zt_ptr_array_get_idx(cut_array, 3), "/d/"), 0);
  ZT_UNIT_ASSERT_EQUAL(test, zt_ptr_array_get_idx(cut_array, 4), NULL);
  ZT_UNIT_ASSERT_EQUAL(test, zt_cstr_cut_free(cut_array), 0);

  cut_array = zt_cstr_cut(split_test, '/', 0);
  ZT_UNIT_ASSERT_NOT_EQUAL(test, cut_array, NULL);
  ZT_UNIT_ASSERT_EQUAL(
      test,
      strcmp((const char *)zt_ptr_array_get_idx(cut_array, 0), "a/b/c/d/"), 0);
  ZT_UNIT_ASSERT_EQUAL(
      test, strcmp((const char *)zt_ptr_array_get_idx(cut_array, 1), "b/c/d/"),
      0);
  ZT_UNIT_ASSERT_EQUAL(
      test, strcmp((const char *)zt_ptr_array_get_idx(cut_array, 2), "c/d/"),
      0);
  ZT_UNIT_ASSERT_EQUAL(
      test, strcmp((const char *)zt_ptr_array_get_idx(cut_array, 3), "d/"), 0);
  ZT_UNIT_ASSERT_EQUAL(test, zt_ptr_array_get_idx(cut_array, 4), NULL);
  ZT_UNIT_ASSERT_EQUAL(test, zt_cstr_cut_free(cut_array), 0);

  cut_array = zt_cstr_tok(split_test, '/', 0);
  ZT_UNIT_ASSERT_NOT_EQUAL(test, cut_array, NULL);
  ZT_UNIT_ASSERT_EQUAL(
      test,
      strcmp((const char *)zt_ptr_array_get_idx(cut_array, 0), "/a/b/c/d"), 0);
  ZT_UNIT_ASSERT_EQUAL(
      test, strcmp((const char *)zt_ptr_array_get_idx(cut_array, 1), "/a/b/c"),
      0);
  ZT_UNIT_ASSERT_EQUAL(
      test, strcmp((const char *)zt_ptr_array_get_idx(cut_array, 2), "/a/b"),
      0);
  ZT_UNIT_ASSERT_EQUAL(
      test, strcmp((const char *)zt_ptr_array_get_idx(cut_array, 3), "/a"), 0);
  ZT_UNIT_ASSERT_EQUAL(test, zt_ptr_array_get_idx(cut_array, 4), NULL);
  ZT_UNIT_ASSERT_EQUAL(test, zt_cstr_cut_free(cut_array), 0);

#if !defined(_WIN32)
  zt_cstr_basename(bname, PATH_MAX, path, NULL);
  ZT_UNIT_ASSERT(test, (!strcmp(bname, "config.foo")));
  zt_cstr_basename(bname, PATH_MAX, path, ".foo");
  ZT_UNIT_ASSERT(test, (!strcmp(bname, "config")));

  zt_cstr_basename(bname, PATH_MAX, "c:\\Windows\\System32\\", NULL);
  ZT_UNIT_ASSERT(test, (!strcmp(bname, "c:\\Windows\\System32\\")));

  zt_cstr_dirname(dname, PATH_MAX, path);
  ZT_UNIT_ASSERT(test, (!strcmp(dname, "/home/jshiffer")));

  zt_cstr_dirname(bname, PATH_MAX, "/foo/bar/baz/");
  ZT_UNIT_ASSERT(test, (!strcmp(bname, "/foo/bar")));

  ZT_UNIT_ASSERT(test, strcmp(free_me = zt_cstr_path_append("/foo/bar", "baz/"),
                              "/foo/bar/baz/") == 0);
  zt_free(free_me);

  ZT_UNIT_ASSERT(test,
                 strcmp(free_me = zt_cstr_path_append("/foo/bar", "/baz/"),
                        "/foo/bar/baz/") == 0);
  zt_free(free_me);

  zt_cstr_dirname(dname, PATH_MAX, "foo");
  ZT_UNIT_ASSERT(test, (!strcmp(dname, ".")));

#else /* _WIN32 */
  /* reverse the mapping */

#endif /* _WIN32 */

  free(strip_test);
  free(chomp_test);

  ZT_UNIT_ASSERT(test, zt_cstr_abspath(PATH_SEPERATOR "tmp") == true);
  ZT_UNIT_ASSERT(test, zt_cstr_abspath("." PATH_SEPERATOR "tmp") == true);
  ZT_UNIT_ASSERT(test, zt_cstr_abspath("tmp") == false);

  ZT_UNIT_ASSERT(test,
                 (strcmp(free_me = zt_cstr_sub(iface_str, 5, 8), "face") == 0));
  zt_free(free_me);
  ZT_UNIT_ASSERT(
      test, (strcmp(free_me = zt_cstr_sub(iface_str, 5, -1), "face") == 0));
  zt_free(free_me);
  ZT_UNIT_ASSERT(
      test, (strcmp(free_me = zt_cstr_sub(iface_str, -4, 8), "face") == 0));
  zt_free(free_me);
  ZT_UNIT_ASSERT(
      test, (strcmp(free_me = zt_cstr_sub(iface_str, -4, -1), "face") == 0));
  zt_free(free_me);
  ZT_UNIT_ASSERT(
      test, (strcmp(free_me = zt_cstr_sub(iface_str, -4, -2), "fac") == 0));
  zt_free(free_me);

  ZT_UNIT_ASSERT(test, (strcmp(free_me = zt_cstr_catv(iface_str, -4, -1,
                                                      " plant", 0, -1, NULL),
                               "face plant") == 0));
  zt_free(free_me);

  ZT_UNIT_ASSERT(
      test, (strcmp(free_me = zt_cstr_cat(iface_str, -4, -1, " plant", 0, -1),
                    "face plant") == 0));
  zt_free(free_me);

  ZT_UNIT_ASSERT(
      test,
      (strcmp(free_me = zt_cstr_map(ALPHA, 0, -1, ALPHA, alpha), alpha) == 0));
  zt_free(free_me);

  ZT_UNIT_ASSERT(test, (strcmp(free_me = zt_cstr_map(ALPHA, 0, -1, NULL, NULL),
                               ALPHA) == 0));
  zt_free(free_me);

  ZT_UNIT_ASSERT(test, zt_cstr_map(NULL, 0, -1, NULL, NULL) == NULL);

  ZT_UNIT_ASSERT(test,
                 (strcmp(free_me = zt_cstr_reverse(ALPHA, 0, -1), AHPLA) == 0));
  zt_free(free_me);

  ZT_UNIT_ASSERT(test,
                 (strcmp(free_me = zt_cstr_dup(ALPHA, 0, -1, 1), ALPHA) == 0));
  zt_free(free_me);

  free_me = zt_cstr_dup(ALPHA, 0, -1, 2);
  free_me2 = zt_cstr_cat(ALPHA, 0, -1, ALPHA, 0, -1);
  ZT_UNIT_ASSERT(test, strcmp(free_me, free_me2) == 0);
  zt_free(free_me);
  zt_free(free_me2);

  ZT_UNIT_ASSERT(test, zt_cstr_find(spain, 0, -1, "") == -1);
  ZT_UNIT_ASSERT(test, zt_cstr_find(spain, 0, -1, "e") == 2);
  ZT_UNIT_ASSERT(test, zt_cstr_find(spain, 0, -1, "rain") == 4);
  ZT_UNIT_ASSERT(test, zt_cstr_find(spain, 0, -1, "in") == 6);
  ZT_UNIT_ASSERT(test, zt_cstr_find(spain, 0, -1, "Spain") == 12);
  ZT_UNIT_ASSERT(test, zt_cstr_find(spain, 0, -1, "zqb") == -1);

  ZT_UNIT_ASSERT(test, zt_cstr_rfind(spain, 0, -1, "") == -1);
  ZT_UNIT_ASSERT(test, zt_cstr_rfind(spain, 0, -1, "e") == 2);
  ZT_UNIT_ASSERT(test, zt_cstr_rfind(spain, 0, -1, "rain") == 4);
  ZT_UNIT_ASSERT(test, zt_cstr_rfind(spain, 0, -1, "in") == 15);
  ZT_UNIT_ASSERT(test, zt_cstr_rfind(spain, 0, -1, "The") == 0);
  ZT_UNIT_ASSERT(test, zt_cstr_rfind(spain, 0, -1, "zqb") == -1);

  ZT_UNIT_ASSERT(test, zt_cstr_any(spain, 0, -1, "zqbS") == 12);
  ZT_UNIT_ASSERT(test, zt_cstr_any(spain, 0, -1, "zqb") == -1);

  ZT_UNIT_ASSERT(test, zt_cstr_rany(spain, 0, -1, "zqbS") == 12);
  ZT_UNIT_ASSERT(test, zt_cstr_rany(spain, 0, -1, "zqb") == -1);

  ZT_UNIT_ASSERT(test,
                 strcmp(&iface_str[zt_cstr_pos(iface_str, -4)], "face") == 0);

  ZT_UNIT_ASSERT(test, zt_cstr_len(iface_str, -4, -1) == 4);

  ZT_UNIT_ASSERT(test, zt_cstr_cmp(iface_str, -4, -1, iface_str, 5, 8) == 0);
  ZT_UNIT_ASSERT(test, zt_cstr_cmp(iface_str, 0, -1, iface_str, 0, -1) == 0);
  ZT_UNIT_ASSERT(test, zt_cstr_cmp(iface_str, 0, -1, iface_str, 0, 4) == 1);
  ZT_UNIT_ASSERT(test, zt_cstr_cmp(iface_str, 0, 4, iface_str, 0, -1) == -1);

  /* */
  ZT_UNIT_ASSERT(test, zt_cstr_chr(iface_str, 0, -1, 'i') == 0);
  ZT_UNIT_ASSERT(test, zt_cstr_rchr(iface_str, 0, -1, 'i') == 0);

  ZT_UNIT_ASSERT(test, zt_cstr_chr(iface_str, 0, -1, 'e') == 3);
  ZT_UNIT_ASSERT(test, zt_cstr_rchr(iface_str, 0, -1, 'e') == 8);

  ZT_UNIT_ASSERT(test, zt_cstr_chr(iface_str, 0, -1, 'r') == 4);
  ZT_UNIT_ASSERT(test, zt_cstr_rchr(iface_str, 0, -1, 'r') == 4);

  ZT_UNIT_ASSERT(test, zt_cstr_upto(iface_str, 0, -1, "xyz") == -1);
  ZT_UNIT_ASSERT(test, zt_cstr_upto(iface_str, 0, -1, "AIb") == 0);
  ZT_UNIT_ASSERT(test, zt_cstr_upto(iface_str, 0, -1, "far") == 4);

  ZT_UNIT_ASSERT(test, zt_cstr_rupto(iface_str, 0, -1, "xyz") == -1);
  ZT_UNIT_ASSERT(test, zt_cstr_rupto(iface_str, 0, -1, "AIb") == 0);
  ZT_UNIT_ASSERT(test, zt_cstr_rupto(iface_str, 0, -1, "aeb") == 8);
  ZT_UNIT_ASSERT(test, zt_cstr_rupto(iface_str, 0, -1, "ntr") == 4);

  ZT_UNIT_ASSERT(test, zt_hex_to_binary(hex, 40, NULL, 0) == 20);
  ZT_UNIT_ASSERT(test, zt_hex_to_binary(hex, 40, digest, 23) == 20);

  ZT_UNIT_ASSERT(test, zt_hex_to_binary(hex, 43, digest, 23) == 0);
  ZT_UNIT_ASSERT(test, errno == EINVAL);

  ZT_UNIT_ASSERT(test, zt_binary_to_hex(digest, 20, hex2, 41) == 40);
  free_me = zt_cstr_map(hex, 0, -1, ALPHA, alpha);
  ZT_UNIT_ASSERT(test, memcmp(hex2, free_me, 40) == 0);
  zt_free(free_me);

  ZT_UNIT_ASSERT(test, zt_hex_to_binary("AX", 2, digest, 1) == 0);
  ZT_UNIT_ASSERT(test, errno == EINVAL);
}